

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall IsoWriter::IsoWriter(IsoWriter *this,IsoHeaderData *hdrData)

{
  IsoHeaderData *hdrData_local;
  IsoWriter *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->m_impId,(string *)&hdrData->impId);
  std::__cxx11::string::string((string *)&this->m_appId,(string *)hdrData);
  this->m_volumeId = hdrData->volumeId;
  File::File(&this->m_file);
  memset(this->m_buffer,0,0x800);
  this->m_currentTime = hdrData->fileTime;
  this->m_metadataMappingFile = (FileEntryInfo *)0x0;
  this->m_partitionStartAddress = 0;
  this->m_partitionEndAddress = 0;
  this->m_metadataLBN = 0;
  this->m_curMetadataPos = 0;
  std::map<int,_MappingEntry,_std::less<int>,_std::allocator<std::pair<const_int,_MappingEntry>_>_>
  ::map(&this->m_mappingEntries);
  this->m_objectUniqId = '\x10';
  this->m_totalFiles = 0;
  this->m_totalDirectories = 0;
  this->m_volumeSize = 0;
  this->m_rootDirInfo = (FileEntryInfo *)0x0;
  this->m_systemStreamDir = (FileEntryInfo *)0x0;
  this->m_metadataFileLen = 0x30000;
  this->m_systemStreamLBN = 0;
  this->m_metadataMirrorLBN = 0;
  this->m_tagLocationBaseAddr = 0;
  this->m_lastWritedObjectID = -1;
  this->m_opened = false;
  std::__cxx11::string::operator=((string *)this," ");
  this->m_layerBreakPoint = 0;
  return;
}

Assistant:

IsoWriter::IsoWriter(const IsoHeaderData &hdrData)
    : m_impId(hdrData.impId),
      m_appId(hdrData.appId),
      m_volumeId(hdrData.volumeId),
      m_buffer{},
      m_currentTime(hdrData.fileTime),
      m_metadataMappingFile(nullptr),
      m_partitionStartAddress(0),
      m_partitionEndAddress(0),
      m_metadataLBN(0),
      m_curMetadataPos(0)
{
    m_objectUniqId = 16;
    m_totalFiles = 0;
    m_totalDirectories = 0;
    m_volumeSize = 0;
    // m_sectorNum = 0;
    m_rootDirInfo = nullptr;
    m_systemStreamDir = nullptr;

    m_metadataFileLen = 0x30000;
    m_systemStreamLBN = 0;
    m_metadataMirrorLBN = 0;
    m_tagLocationBaseAddr = 0;
    m_lastWritedObjectID = -1;
    m_opened = false;
    m_volumeLabel = " ";
    m_layerBreakPoint = 0;
}